

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_log__recalc_point(int caller_locked,st_ptls_log_point_t *point)

{
  int iVar1;
  ulong local_28;
  size_t slot;
  uint32_t new_active;
  st_ptls_log_point_t *point_local;
  int caller_locked_local;
  
  if (caller_locked == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&logctx.mutex);
  }
  if ((point->state).generation != ptls_log._generation) {
    slot._4_4_ = 0;
    for (local_28 = 0; local_28 < 0x20; local_28 = local_28 + 1) {
      if (logctx.conns[local_28].points != (char *)0x0) {
        iVar1 = is_in_stringlist(logctx.conns[local_28].points,point->name);
        if (iVar1 != 0) {
          slot._4_4_ = 1 << ((byte)local_28 & 0x1f) | slot._4_4_;
        }
      }
    }
    (point->state).active_conns = slot._4_4_;
    (point->state).generation = ptls_log._generation;
  }
  if (caller_locked == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&logctx.mutex);
  }
  return;
}

Assistant:

void ptls_log__recalc_point(int caller_locked, struct st_ptls_log_point_t *point)
{
    if (!caller_locked)
        pthread_mutex_lock(&logctx.mutex);

    if (point->state.generation != ptls_log._generation) {
        /* update active bitmap */
        uint32_t new_active = 0;
        for (size_t slot = 0; slot < PTLS_ELEMENTSOF(logctx.conns); ++slot)
            if (logctx.conns[slot].points != NULL && is_in_stringlist(logctx.conns[slot].points, point->name))
                new_active |= (uint32_t)1 << slot;
        point->state.active_conns = new_active;
        point->state.generation = ptls_log._generation;
    }

    if (!caller_locked)
        pthread_mutex_unlock(&logctx.mutex);
}